

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall
duckdb::HistogramBinState<unsigned_long>::Destroy(HistogramBinState<unsigned_long> *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var1;
  
  p_Var1 = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this->bin_boundaries;
  if (p_Var1 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(p_Var1);
    operator_delete(p_Var1);
    this->bin_boundaries = (unsafe_vector<unsigned_long> *)0x0;
  }
  p_Var1 = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts;
  if (p_Var1 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(p_Var1);
    operator_delete(p_Var1);
    this->counts = (unsafe_vector<idx_t> *)0x0;
  }
  return;
}

Assistant:

void Destroy() {
		if (bin_boundaries) {
			delete bin_boundaries;
			bin_boundaries = nullptr;
		}
		if (counts) {
			delete counts;
			counts = nullptr;
		}
	}